

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
pstore::small_vector<int,_8UL>::small_vector
          (small_vector<int,_8UL> *this,initializer_list<int> init)

{
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->small_buffer_)._M_elems[6] = 0;
  (this->small_buffer_)._M_elems[7] = 0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->small_buffer_)._M_elems[2] = 0;
  (this->small_buffer_)._M_elems[3] = 0;
  (this->small_buffer_)._M_elems[4] = 0;
  (this->small_buffer_)._M_elems[5] = 0;
  this->elements_ = 0;
  (this->small_buffer_)._M_elems[0] = 0;
  (this->small_buffer_)._M_elems[1] = 0;
  this->buffer_ = (this->small_buffer_)._M_elems;
  reserve(this,init._M_len);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<int_const*,std::back_insert_iterator<pstore::small_vector<int,8ul>>>
            (init._M_array,init._M_array + init._M_len,
             (back_insert_iterator<pstore::small_vector<int,_8UL>_>)this);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (std::initializer_list<ElementType> init)
            : small_vector () {
        this->reserve (init.size ());
        std::copy (std::begin (init), std::end (init), std::back_inserter (*this));
    }